

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureBarrierBasicOutline::TextureBarrierBasicOutline
          (TextureBarrierBasicOutline *this,Context *context,API api,char *name,char *description)

{
  size_t i;
  long lVar1;
  
  TextureBarrierBaseTest::TextureBarrierBaseTest
            (&this->super_TextureBarrierBaseTest,context,api,name,description);
  (this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01dd2a10;
  this->m_width = 0;
  this->m_height = 0;
  this->m_actual = (GLuint *)0x0;
  *(undefined8 *)&(this->super_TextureBarrierBaseTest).field_0x7c = 0;
  this->m_vbo = 0;
  this->m_fbo = 0;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    this->m_tex[lVar1] = 0;
    this->m_reference[lVar1] = (GLuint *)0x0;
  }
  return;
}

Assistant:

TextureBarrierBasicOutline(deqp::Context& context, TextureBarrierTests::API api, const char* name,
							   const char* description)
		: TextureBarrierBaseTest(context, api, name, description)
		, m_program(0)
		, m_vao(0)
		, m_vbo(0)
		, m_fbo(0)
		, m_width(0)
		, m_height(0)
		, m_actual(DE_NULL)
	{
		for (size_t i = 0; i < NUM_TEXTURES; ++i)
		{
			m_tex[i]	   = 0;
			m_reference[i] = DE_NULL;
		}
	}